

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathBoxAlgo.h
# Opt level: O2

Box<Imath_3_2::Vec3<float>_> * __thiscall
Imath_3_2::transform<float,float>
          (Box<Imath_3_2::Vec3<float>_> *__return_storage_ptr__,Imath_3_2 *this,
          Box<Imath_3_2::Vec3<float>_> *box,Matrix44<float> *m)

{
  bool bVar1;
  int i;
  long lVar2;
  Box<Imath_3_2::Vec3<float>_> *pBVar3;
  long lVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  Vec3<float> points [8];
  Vec3<float> local_98;
  float fStack_8c;
  float local_88;
  undefined4 local_84;
  float local_80;
  undefined4 local_7c;
  float local_78;
  float fStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined4 local_68;
  float local_64;
  float fStack_60;
  undefined4 uStack_5c;
  float fStack_58;
  undefined4 local_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  float fStack_48;
  undefined4 local_44;
  undefined4 local_40;
  undefined4 local_3c;
  Vec3<float> local_2c;
  
  bVar1 = Box<Imath_3_2::Vec3<float>_>::isEmpty((Box<Imath_3_2::Vec3<float>_> *)this);
  if ((bVar1) ||
     (bVar1 = Box<Imath_3_2::Vec3<float>_>::isInfinite((Box<Imath_3_2::Vec3<float>_> *)this), bVar1)
     ) {
    Box<Imath_3_2::Vec3<float>_>::Box(__return_storage_ptr__,(Box<Imath_3_2::Vec3<float>_> *)this);
    return __return_storage_ptr__;
  }
  fVar5 = (box->max).x;
  if ((((fVar5 == 0.0) && (((!NAN(fVar5) && (fVar5 = box[1].min.y, fVar5 == 0.0)) && (!NAN(fVar5))))
       ) && (((fVar5 = box[1].max.z, fVar5 == 0.0 && (!NAN(fVar5))) &&
             (fVar5 = box[2].max.x, fVar5 == 1.0)))) && (!NAN(fVar5))) {
    (__return_storage_ptr__->min).x = 3.4028235e+38;
    (__return_storage_ptr__->min).y = 3.4028235e+38;
    *(undefined8 *)&(__return_storage_ptr__->min).z = 0xff7fffff7f7fffff;
    (__return_storage_ptr__->max).y = -3.4028235e+38;
    (__return_storage_ptr__->max).z = -3.4028235e+38;
    pBVar3 = box;
    for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
      fVar5 = (&box[2].min.x)[lVar2];
      (&(__return_storage_ptr__->min).x)[lVar2] = fVar5;
      fVar6 = fVar5;
      for (lVar4 = 0; lVar4 != 0xc; lVar4 = lVar4 + 4) {
        fVar7 = (&(pBVar3->min).x)[lVar4];
        fVar8 = *(float *)(this + lVar4) * fVar7;
        fVar7 = fVar7 * *(float *)(this + lVar4 + 0xc);
        fVar9 = fVar8;
        if (fVar7 <= fVar8) {
          fVar9 = fVar7;
        }
        fVar5 = fVar5 + fVar9;
        if (fVar7 <= fVar8) {
          fVar7 = fVar8;
        }
        fVar6 = fVar6 + fVar7;
      }
      (&(__return_storage_ptr__->min).x)[lVar2] = fVar5;
      (&(__return_storage_ptr__->max).x)[lVar2] = fVar6;
      pBVar3 = (Box<Imath_3_2::Vec3<float>_> *)&(pBVar3->min).y;
    }
    return __return_storage_ptr__;
  }
  local_98.x = *(float *)this;
  local_98.y = *(float *)(this + 4);
  local_98.z = *(float *)(this + 8);
  local_68 = *(undefined4 *)(this + 0xc);
  local_7c = *(undefined4 *)(this + 0x10);
  local_84 = *(undefined4 *)(this + 0x14);
  (__return_storage_ptr__->min).x = 3.4028235e+38;
  (__return_storage_ptr__->min).y = 3.4028235e+38;
  *(undefined8 *)&(__return_storage_ptr__->min).z = 0xff7fffff7f7fffff;
  (__return_storage_ptr__->max).y = -3.4028235e+38;
  (__return_storage_ptr__->max).z = -3.4028235e+38;
  fStack_8c = local_98.x;
  local_88 = local_98.y;
  local_80 = local_98.x;
  local_78 = local_98.z;
  fStack_74 = local_98.x;
  uStack_70 = local_7c;
  uStack_6c = local_84;
  local_64 = local_98.y;
  fStack_60 = local_98.z;
  uStack_5c = local_68;
  fStack_58 = local_98.y;
  local_54 = local_84;
  uStack_50 = local_68;
  uStack_4c = local_7c;
  fStack_48 = local_98.z;
  local_44 = local_68;
  local_40 = local_7c;
  local_3c = local_84;
  for (lVar2 = 0; lVar2 != 0x60; lVar2 = lVar2 + 0xc) {
    operator*((Vec3<float> *)((long)&local_98.x + lVar2),(Matrix44<float> *)box);
    Box<Imath_3_2::Vec3<float>_>::extendBy(__return_storage_ptr__,&local_2c);
  }
  return __return_storage_ptr__;
}

Assistant:

IMATH_HOSTDEVICE Box<Vec3<S>>
transform (const Box<Vec3<S>>& box, const Matrix44<T>& m) IMATH_NOEXCEPT
{
    if (box.isEmpty () || box.isInfinite ()) return box;

    //
    // If the last column of m is (0 0 0 1) then m is an affine
    // transform, and we use the fast Graphics Gems trick.
    //

    if (m[0][3] == 0 && m[1][3] == 0 && m[2][3] == 0 && m[3][3] == 1)
    {
        Box<Vec3<S>> newBox;

        for (int i = 0; i < 3; i++)
        {
            newBox.min[i] = newBox.max[i] = (S) m[3][i];

            for (int j = 0; j < 3; j++)
            {
                S a, b;

                a = (S) m[j][i] * box.min[j];
                b = (S) m[j][i] * box.max[j];

                if (a < b)
                {
                    newBox.min[i] += a;
                    newBox.max[i] += b;
                }
                else
                {
                    newBox.min[i] += b;
                    newBox.max[i] += a;
                }
            }
        }

        return newBox;
    }

    //
    // M is a projection matrix.  Do things the naive way:
    // Transform the eight corners of the box, and find an
    // axis-parallel box that encloses the transformed corners.
    //

    Vec3<S> points[8];

    points[0][0] = points[1][0] = points[2][0] = points[3][0] = box.min[0];
    points[4][0] = points[5][0] = points[6][0] = points[7][0] = box.max[0];

    points[0][1] = points[1][1] = points[4][1] = points[5][1] = box.min[1];
    points[2][1] = points[3][1] = points[6][1] = points[7][1] = box.max[1];

    points[0][2] = points[2][2] = points[4][2] = points[6][2] = box.min[2];
    points[1][2] = points[3][2] = points[5][2] = points[7][2] = box.max[2];

    Box<Vec3<S>> newBox;

    for (int i = 0; i < 8; i++)
        newBox.extendBy (points[i] * m);

    return newBox;
}